

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O3

int find_ipv4_start_node(MMDB_s *mmdb)

{
  ushort uVar1;
  uint uVar2;
  code *pcVar3;
  uint8_t *puVar4;
  uint uVar5;
  int iVar6;
  uint16_t uVar7;
  ushort uVar8;
  
  if ((mmdb->ipv4_start_node).node_value != 0) {
    return 0;
  }
  uVar1 = mmdb->full_record_byte_size;
  iVar6 = 6;
  if ((ushort)(uVar1 - 6) < 3) {
    uVar2 = (mmdb->metadata).node_count;
    if (uVar2 == 0) {
      uVar5 = 0;
      uVar7 = 0;
    }
    else {
      pcVar3 = (code *)(&PTR_get_uint24_0010adb0)[(ushort)(uVar1 - 6)];
      puVar4 = mmdb->file_content;
      uVar5 = 0;
      uVar8 = 0;
      do {
        if (mmdb->data_section < puVar4 + uVar5 * uVar1 + uVar1) {
          return 2;
        }
        uVar5 = (*pcVar3)(puVar4 + uVar5 * uVar1);
        uVar7 = uVar8 + 1;
      } while ((uVar8 < 0x5f) && (uVar8 = uVar7, uVar5 < uVar2));
    }
    (mmdb->ipv4_start_node).node_value = uVar5;
    (mmdb->ipv4_start_node).netmask = uVar7;
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int find_ipv4_start_node(MMDB_s *const mmdb) {
    /* In a pathological case of a database with a single node search tree,
     * this check will be true even after we've found the IPv4 start node, but
     * that doesn't seem worth trying to fix. */
    if (mmdb->ipv4_start_node.node_value != 0) {
        return MMDB_SUCCESS;
    }

    record_info_s record_info = record_info_for_database(mmdb);
    if (record_info.right_record_offset == 0) {
        return MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
    }

    const uint8_t *search_tree = mmdb->file_content;
    uint32_t node_value = 0;
    const uint8_t *record_pointer;
    uint16_t netmask;
    uint32_t node_count = mmdb->metadata.node_count;

    for (netmask = 0; netmask < 96 && node_value < node_count; netmask++) {
        record_pointer = &search_tree[node_value * record_info.record_length];
        if (record_pointer + record_info.record_length > mmdb->data_section) {
            return MMDB_CORRUPT_SEARCH_TREE_ERROR;
        }
        node_value = record_info.left_record_getter(record_pointer);
    }

    mmdb->ipv4_start_node.node_value = node_value;
    mmdb->ipv4_start_node.netmask = netmask;

    return MMDB_SUCCESS;
}